

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

Node * CleanNode(TidyDocImpl *doc,Node *node)

{
  Node **ppNVar1;
  TidyTriState state;
  TidyTriState state_00;
  Node *node_00;
  Node *pNVar2;
  AttVal *av;
  AttVal **ppAVar3;
  Bool BVar4;
  uint uVar5;
  uint uVar6;
  AttVal *pAVar7;
  Dict *pDVar8;
  tmbstr ptVar9;
  AttVal *pAVar10;
  long lVar11;
  uint i;
  TidyTagId TVar12;
  char *pcVar13;
  TidyTagId *pTVar14;
  Node **in_R8;
  Node *pNVar15;
  tmbchar buf [256];
  tmbchar local_138 [12];
  char acStack_12c [252];
  
  state = *(TidyTriState *)((doc->config).value + 0x32);
  state_00 = *(TidyTriState *)((doc->config).value + 0x34);
  BVar4 = prvTidynodeIsElement(node);
  if (BVar4 == no) {
    return node;
  }
  ppNVar1 = &node->next;
LAB_0014d948:
  if ((node != (Node *)0x0) && (pDVar8 = node->tag, pDVar8 != (Dict *)0x0)) {
    TVar12 = pDVar8->id;
    if ((TVar12 != TidyTag_DIR) && ((TVar12 != TidyTag_UL && (TVar12 != TidyTag_OL)))) {
LAB_0014d97d:
      if (((((TVar12 == TidyTag_UL) || (TVar12 == TidyTag_OL)) &&
           ((pNVar15 = node->content, pNVar15 != (Node *)0x0 &&
            ((pNVar15->next == (Node *)0x0 && (node_00 = pNVar15->content, node_00 != (Node *)0x0)))
            ))) && (node_00->tag == pDVar8)) && (node_00->next == (Node *)0x0)) {
        node_00->next = node->next;
        pNVar2 = node->prev;
        node_00->parent = node->parent;
        node_00->prev = pNVar2;
        prvTidyFixNodeLinks(node_00);
        pNVar15->content = (Node *)0x0;
        prvTidyFreeNode(doc,pNVar15);
        *ppNVar1 = (Node *)0x0;
        node->content = (Node *)0x0;
        prvTidyFreeNode(doc,node);
        pNVar15 = node_00->prev;
        if (pNVar15 == (Node *)0x0) {
          return node_00;
        }
        if (pNVar15->tag == (Dict *)0x0) {
          return node_00;
        }
        TVar12 = pNVar15->tag->id;
        if ((TVar12 != TidyTag_UL) && (TVar12 != TidyTag_OL)) {
          return node_00;
        }
        pNVar2 = pNVar15->last;
        if (pNVar2 == (Node *)0x0) {
          return node_00;
        }
        pNVar15->next = node_00->next;
        prvTidyFixNodeLinks(pNVar15);
        node_00->parent = pNVar2;
        node_00->next = (Node *)0x0;
        node_00->prev = pNVar2->last;
        prvTidyFixNodeLinks(node_00);
        CleanNode(doc,node_00);
        return node_00;
      }
      if (pDVar8->id != TidyTag_CENTER) goto LAB_0014d9c8;
      RenameElem(doc,node,TidyTag_DIV);
      pcVar13 = "text-align: center";
LAB_0014d9be:
      prvTidyAddStyleProperty(doc,node,pcVar13);
      goto LAB_0014ddf8;
    }
    pNVar15 = node->content;
    if ((pNVar15 == (Node *)0x0) ||
       ((((pNVar15->next != (Node *)0x0 || (pNVar15->tag == (Dict *)0x0)) ||
         (pNVar15->tag->id != TidyTag_LI)) || (pNVar15->implicit == no)))) {
      TVar12 = pDVar8->id;
      goto LAB_0014d97d;
    }
    pDVar8 = prvTidyLookupTagDef(TidyTag_DIV);
    node->tag = pDVar8;
    (*doc->allocator->vtbl->free)(doc->allocator,node->element);
    ptVar9 = prvTidytmbstrdup(doc->allocator,"div");
    node->element = ptVar9;
    pcVar13 = "margin-left: 2em";
    goto LAB_0014dde8;
  }
LAB_0014d9c8:
  BVar4 = MergeNestedElements(doc,TidyTag_DIV,state,node,in_R8);
  if ((BVar4 == no) &&
     (BVar4 = MergeNestedElements(doc,TidyTag_SPAN,state_00,node,in_R8), BVar4 == no)) {
    if (node == (Node *)0x0) {
      BVar4 = prvTidynodeHasCM((Node *)0x0,0xe8);
      if (BVar4 == no) goto LAB_0014dc05;
LAB_0014db45:
      pAVar7 = node->attributes;
      if (pAVar7 != (AttVal *)0x0) {
        pAVar10 = (AttVal *)0x0;
        do {
          if ((pAVar7->dict != (Attribute *)0x0) && (pAVar7->dict->id == TidyAttr_ALIGN)) {
            if (pAVar10 == (AttVal *)0x0) {
              pAVar10 = (AttVal *)&node->attributes;
            }
            pAVar10->next = pAVar7->next;
            ptVar9 = pAVar7->value;
            if (ptVar9 == (tmbstr)0x0) goto LAB_0014dbe6;
            prvTidytmbstrcpy(local_138,"text-align: ");
            lVar11 = 0xc;
            goto LAB_0014dbab;
          }
          ppAVar3 = &pAVar7->next;
          pAVar10 = pAVar7;
          pAVar7 = *ppAVar3;
        } while (*ppAVar3 != (AttVal *)0x0);
      }
      goto LAB_0014dbf1;
    }
    if ((((node->tag != (Dict *)0x0) && (uVar5 = node->tag->id - TidyTag_TABLE, uVar5 < 9)) &&
        ((0x125U >> (uVar5 & 0x1f) & 1) != 0)) &&
       (pAVar7 = prvTidyAttrGetById(node,TidyAttr_BGCOLOR), pAVar7 != (AttVal *)0x0)) {
      prvTidytmbsnprintf(local_138,0x100,"background-color: %s");
      prvTidyRemoveAttribute(doc,node,pAVar7);
      prvTidyAddStyleProperty(doc,node,local_138);
    }
    BVar4 = CanApplyBlockStyle(node);
    if (BVar4 != no) {
      if ((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_CAPTION)) goto LAB_0014db45;
      goto LAB_0014dbf1;
    }
    goto LAB_0014dc05;
  }
  goto LAB_0014ddf8;
  while (lVar11 = lVar11 + 1, lVar11 != 0x7f) {
LAB_0014dbab:
    uVar6 = prvTidyToLower((int)ptVar9[lVar11 + -0xc]);
    local_138[lVar11] = (char)uVar6;
    if ((char)uVar6 == '\0') goto LAB_0014dbcc;
  }
  lVar11 = 0x7f;
LAB_0014dbcc:
  local_138[lVar11] = '\0';
  prvTidyAddStyleProperty(doc,node,local_138);
LAB_0014dbe6:
  prvTidyFreeAttribute(doc,pAVar7);
LAB_0014dbf1:
  pNVar15 = node->content;
  if ((pNVar15 != (Node *)0x0) && (pNVar15->next == (Node *)0x0)) {
    lVar11 = 0;
    pcVar13 = "font-weight: bold";
    pTVar14 = &DAT_001c1e80;
    do {
      if (pNVar15->tag == (Dict *)0x0) {
        if (lVar11 == 4) break;
      }
      else {
        TVar12 = pNVar15->tag->id;
        if (TVar12 == *pTVar14) goto LAB_0014ddd1;
        if (lVar11 == 4) goto LAB_0014de0a;
      }
      lVar11 = lVar11 + 1;
      pTVar14 = &DAT_001c1e80 + lVar11 * 6;
      pcVar13 = *(char **)(&UNK_001c1e88 + lVar11 * 0x18);
    } while( true );
  }
LAB_0014dc05:
  BVar4 = CanApplyInlineStyle(node);
  if (((BVar4 != no) && (pNVar15 = node->content, pNVar15 != (Node *)0x0)) &&
     (pNVar15->next == (Node *)0x0)) {
    lVar11 = 0;
    pcVar13 = "font-weight: bold";
    pTVar14 = &DAT_001c1e80;
    do {
      if (pNVar15->tag == (Dict *)0x0) {
        if (lVar11 == 4) break;
      }
      else {
        TVar12 = pNVar15->tag->id;
        if (TVar12 == *pTVar14) goto LAB_0014ddd1;
        if (lVar11 == 4) goto LAB_0014de15;
      }
      lVar11 = lVar11 + 1;
      pTVar14 = &DAT_001c1e80 + lVar11 * 6;
      pcVar13 = *(char **)(&UNK_001c1e88 + lVar11 * 0x18);
    } while( true );
  }
LAB_0014dc25:
  if (((node->parent->content != node) || (*ppNVar1 != (Node *)0x0)) ||
     ((BVar4 = CanApplyBlockStyle(node->parent), BVar4 == no &&
      (BVar4 = CanApplyInlineStyle(node->parent), BVar4 == no)))) {
    lVar11 = 0;
    pcVar13 = "font-weight: bold";
    do {
      if (((*(int *)((long)&DAT_001c1e90 + lVar11) != 0) && (node->tag != (Dict *)0x0)) &&
         (node->tag->id == *(TidyTagId *)((long)&DAT_001c1e80 + lVar11))) {
        RenameElem(doc,node,TidyTag_SPAN);
        goto LAB_0014d9be;
      }
      pcVar13 = *(char **)((long)&PTR_anon_var_dwarf_3e99c_001c1ea0 + lVar11);
      lVar11 = lVar11 + 0x18;
    } while (lVar11 != 0x78);
  }
  if (node->tag == (Dict *)0x0) {
    return node;
  }
  if (node->tag->id != TidyTag_FONT) {
    return node;
  }
  if (((node->parent->content == node) && (*ppNVar1 == (Node *)0x0)) &&
     (BVar4 = CanApplyBlockStyle(node->parent), BVar4 != no)) {
    return node;
  }
  AddFontStyles(doc,node,node->attributes);
  pAVar7 = node->attributes;
  pAVar10 = (AttVal *)0x0;
  while (av = pAVar7, av != (AttVal *)0x0) {
    pAVar7 = av->next;
    if ((av->dict == (Attribute *)0x0) || (av->dict->id != TidyAttr_STYLE)) {
      prvTidyFreeAttribute(doc,av);
    }
    else {
      av->next = (AttVal *)0x0;
      pAVar10 = av;
    }
  }
  node->attributes = pAVar10;
  RenameElem(doc,node,TidyTag_SPAN);
LAB_0014ddf8:
  BVar4 = prvTidynodeIsElement(node);
  if (BVar4 == no) {
    return node;
  }
  goto LAB_0014d948;
LAB_0014de0a:
  if (TVar12 == TidyTag_FONT) goto LAB_0014de1e;
  goto LAB_0014dc05;
LAB_0014ddd1:
  MergeStyles(doc,node,pNVar15);
LAB_0014dde8:
  prvTidyAddStyleProperty(doc,node,pcVar13);
LAB_0014dded:
  StripOnlyChild(doc,node);
  goto LAB_0014ddf8;
LAB_0014de15:
  if (TVar12 == TidyTag_FONT) {
LAB_0014de1e:
    MergeStyles(doc,node,pNVar15);
    AddFontStyles(doc,node,pNVar15->attributes);
    goto LAB_0014dded;
  }
  goto LAB_0014dc25;
}

Assistant:

Node* CleanNode( TidyDocImpl* doc, Node *node )
{
    Node *next = NULL;
    TidyTriState mergeDivs = cfgAutoBool(doc, TidyMergeDivs);
    TidyTriState mergeSpans = cfgAutoBool(doc, TidyMergeSpans);

    for (next = node; TY_(nodeIsElement)(node); node = next)
    {
        if ( Dir2Div(doc, node, &next) )
            continue;

        /* Special case: true result means
        ** that arg node and its parent no longer exist.
        ** So we must jump back up the CreateStyleProperties()
        ** call stack until we have a valid node reference.
        */
        if ( NestedList(doc, node, &next) )
            return next;

        if ( Center2Div(doc, node, &next) )
            continue;

        if ( MergeNestedElements(doc, TidyTag_DIV, mergeDivs, node, &next) )
            continue;

        if ( MergeNestedElements(doc, TidyTag_SPAN, mergeSpans, node, &next) )
            continue;

        if ( BlockStyle(doc, node, &next) )
            continue;

        if ( InlineStyle(doc, node, &next) )
            continue;

        if ( InlineElementToCSS(doc, node, &next) )
            continue;

        if ( Font2Span(doc, node, &next) )
            continue;

        break;
    }

    return next;
}